

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::MinMaxState<duckdb::interval_t>,duckdb::interval_t,duckdb::MaxOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  interval_t *piVar2;
  MinMaxState<duckdb::interval_t> *state;
  int64_t iVar3;
  MinMaxState<duckdb::interval_t> **states_00;
  int32_t iVar4;
  ulong uVar5;
  ulong uVar6;
  AggregateUnaryInput input_1;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat idata;
  AggregateUnaryInput local_d8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      piVar2 = (interval_t *)input->data;
      state = *(MinMaxState<duckdb::interval_t> **)states->data;
      iVar4 = piVar2->days;
      iVar3 = piVar2->micros;
      if (state->isset != false) {
        MaxOperation::Execute<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>>
                  (state,*piVar2,aggr_input_data);
        return;
      }
      (state->value).months = piVar2->months;
      (state->value).days = iVar4;
      (state->value).micros = iVar3;
      state->isset = true;
    }
  }
  else {
    if (input->vector_type == FLAT_VECTOR && states->vector_type == FLAT_VECTOR) {
      piVar2 = (interval_t *)input->data;
      states_00 = (MinMaxState<duckdb::interval_t> **)states->data;
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::MinMaxState<duckdb::interval_t>,duckdb::interval_t,duckdb::MaxOperation>
                (piVar2,aggr_input_data,states_00,&input->validity,count);
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
    Vector::ToUnifiedFormat(input,count,&local_78);
    Vector::ToUnifiedFormat(states,count,&local_c0);
    local_d8.input_mask = &local_78.validity;
    local_d8.input = aggr_input_data;
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      local_d8.input_idx = 0;
      if (count != 0) {
        uVar6 = 0;
        do {
          local_d8.input_idx = uVar6;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            local_d8.input_idx = (idx_t)(local_78.sel)->sel_vector[uVar6];
          }
          uVar5 = uVar6;
          if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
            uVar5 = (ulong)(local_c0.sel)->sel_vector[uVar6];
          }
          MinMaxBase::
          Operation<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>,duckdb::MaxOperation>
                    (*(MinMaxState<duckdb::interval_t> **)(local_c0.data + uVar5 * 8),
                     (interval_t *)(local_78.data + local_d8.input_idx * 0x10),&local_d8);
          uVar6 = uVar6 + 1;
        } while (count != uVar6);
      }
    }
    else {
      local_d8.input_idx = 0;
      if (count != 0) {
        uVar6 = 0;
        do {
          local_d8.input_idx = uVar6;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            local_d8.input_idx = (idx_t)(local_78.sel)->sel_vector[uVar6];
          }
          uVar5 = uVar6;
          if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
            uVar5 = (ulong)(local_c0.sel)->sel_vector[uVar6];
          }
          if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [local_d8.input_idx >> 6] >> (local_d8.input_idx & 0x3f) & 1) != 0)) {
            MinMaxBase::
            Operation<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>,duckdb::MaxOperation>
                      (*(MinMaxState<duckdb::interval_t> **)(local_c0.data + uVar5 * 8),
                       (interval_t *)(local_78.data + local_d8.input_idx * 0x10),&local_d8);
          }
          uVar6 = uVar6 + 1;
        } while (count != uVar6);
      }
    }
    if (local_c0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}